

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsRoberts_dns_constraints.c
# Opt level: O0

int Jac(sunrealtype t,N_Vector y,N_Vector fy,SUNMatrix J,void *user_data,N_Vector tmp1,N_Vector tmp2
       ,N_Vector tmp3)

{
  double dVar1;
  double dVar2;
  sunrealtype y3;
  sunrealtype y2;
  N_Vector tmp2_local;
  N_Vector tmp1_local;
  void *user_data_local;
  SUNMatrix J_local;
  N_Vector fy_local;
  N_Vector y_local;
  sunrealtype t_local;
  
  dVar1 = *(double *)(*(long *)((long)y->content + 0x10) + 8);
  dVar2 = *(double *)(*(long *)((long)y->content + 0x10) + 0x10);
  *(undefined8 *)**(undefined8 **)((long)J->content + 0x20) = 0xbfa47ae147ae147b;
  **(double **)(*(long *)((long)J->content + 0x20) + 8) = dVar2 * 10000.0;
  **(double **)(*(long *)((long)J->content + 0x20) + 0x10) = dVar1 * 10000.0;
  *(undefined8 *)(**(long **)((long)J->content + 0x20) + 8) = 0x3fa47ae147ae147b;
  *(double *)(*(long *)(*(long *)((long)J->content + 0x20) + 8) + 8) =
       dVar2 * -10000.0 + -(dVar1 * 60000000.0);
  *(double *)(*(long *)(*(long *)((long)J->content + 0x20) + 0x10) + 8) = dVar1 * -10000.0;
  *(undefined8 *)(**(long **)((long)J->content + 0x20) + 0x10) = 0;
  *(double *)(*(long *)(*(long *)((long)J->content + 0x20) + 8) + 0x10) = dVar1 * 60000000.0;
  *(undefined8 *)(*(long *)(*(long *)((long)J->content + 0x20) + 0x10) + 0x10) = 0;
  return 0;
}

Assistant:

static int Jac(sunrealtype t, N_Vector y, N_Vector fy, SUNMatrix J,
               void* user_data, N_Vector tmp1, N_Vector tmp2, N_Vector tmp3)
{
  sunrealtype y2, y3;

  y2 = Ith(y, 2);
  y3 = Ith(y, 3);

  IJth(J, 1, 1) = SUN_RCONST(-0.04);
  IJth(J, 1, 2) = SUN_RCONST(1.0e4) * y3;
  IJth(J, 1, 3) = SUN_RCONST(1.0e4) * y2;

  IJth(J, 2, 1) = SUN_RCONST(0.04);
  IJth(J, 2, 2) = SUN_RCONST(-1.0e4) * y3 - SUN_RCONST(6.0e7) * y2;
  IJth(J, 2, 3) = SUN_RCONST(-1.0e4) * y2;

  IJth(J, 3, 1) = ZERO;
  IJth(J, 3, 2) = SUN_RCONST(6.0e7) * y2;
  IJth(J, 3, 3) = ZERO;

  return (0);
}